

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

int array_container_rank(array_container_t *arr,uint16_t x)

{
  int32_t iVar1;
  uint16_t in_SI;
  int32_t *in_RDI;
  _Bool is_present;
  int32_t idx;
  int local_4;
  
  iVar1 = binarySearch(*(uint16_t **)(in_RDI + 2),*in_RDI,in_SI);
  if (iVar1 < 0) {
    local_4 = -1 - iVar1;
  }
  else {
    local_4 = iVar1 + 1;
  }
  return local_4;
}

Assistant:

inline int array_container_rank(const array_container_t *arr, uint16_t x) {
    const int32_t idx = binarySearch(arr->array, arr->cardinality, x);
    const bool is_present = idx >= 0;
    if (is_present) {
        return idx + 1;
    } else {
        return -idx - 1;
    }
}